

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint16_t x;
  ushort x_00;
  int iVar1;
  uint uVar2;
  uint pos;
  int iVar3;
  array_container_t *src_1;
  array_container_t *array2;
  array_container_t *paVar4;
  int pos_00;
  ulong uVar5;
  ulong uVar6;
  byte local_4a;
  byte local_49;
  uint64_t local_48;
  int32_t local_3c;
  container_t *local_38;
  
  iVar1 = (x1->high_low_container).size;
  local_3c = (x2->high_low_container).size;
  uVar5 = 0;
  pos = 0;
  local_48 = 0;
LAB_0011543b:
  uVar6 = uVar5 & 0xffff;
LAB_0011543f:
  if ((iVar1 <= (int)pos) || (pos_00 = (int)uVar5, local_3c <= pos_00)) {
    return local_48;
  }
  uVar2 = pos & 0xffff;
  x = (x1->high_low_container).keys[uVar2];
  x_00 = (x2->high_low_container).keys[uVar6];
  if (x == x_00) {
    local_49 = (x1->high_low_container).typecodes[uVar2];
    local_4a = (x2->high_low_container).typecodes[uVar6];
    local_38 = (x2->high_low_container).containers[uVar6];
    src_1 = (array_container_t *)
            container_unwrap_shared((x1->high_low_container).containers[uVar2],&local_49);
    array2 = (array_container_t *)container_unwrap_shared(local_38,&local_4a);
    switch((uint)local_4a + (uint)local_49 * 4) {
    case 5:
      iVar3 = bitset_container_and_justcard
                        ((bitset_container_t *)src_1,(bitset_container_t *)array2);
      break;
    case 6:
      paVar4 = src_1;
      goto LAB_00115558;
    case 7:
      paVar4 = src_1;
      goto LAB_00115565;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1369,
                    "int container_and_cardinality(const container_t *, uint8_t, const container_t *, uint8_t)"
                   );
    case 9:
      paVar4 = array2;
      array2 = src_1;
LAB_00115558:
      iVar3 = array_bitset_container_intersection_cardinality(array2,(bitset_container_t *)paVar4);
      break;
    case 10:
      iVar3 = array_container_intersection_cardinality(src_1,array2);
      break;
    case 0xb:
      paVar4 = array2;
      goto LAB_00115543;
    case 0xd:
      paVar4 = array2;
      array2 = src_1;
LAB_00115565:
      iVar3 = run_bitset_container_intersection_cardinality
                        ((run_container_t *)array2,(bitset_container_t *)paVar4);
      break;
    case 0xe:
      paVar4 = src_1;
      src_1 = array2;
LAB_00115543:
      iVar3 = array_run_container_intersection_cardinality(src_1,(run_container_t *)paVar4);
      break;
    case 0xf:
      iVar3 = run_container_intersection_cardinality
                        ((run_container_t *)src_1,(run_container_t *)array2);
    }
    local_48 = local_48 + (long)iVar3;
    pos = pos + 1;
    uVar5 = (ulong)(pos_00 + 1);
  }
  else {
    if (x < x_00) goto code_r0x0011546f;
    uVar2 = ra_advance_until(&x2->high_low_container,x,pos_00);
    uVar5 = (ulong)uVar2;
  }
  goto LAB_0011543b;
code_r0x0011546f:
  pos = ra_advance_until(&x1->high_low_container,x_00,pos);
  goto LAB_0011543f;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}